

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRTreeBuildVisitor.cpp
# Opt level: O2

void __thiscall
IRTreeBuildVisitor::Visit(IRTreeBuildVisitor *this,ListOfStatements *list_of_statements)

{
  pointer ppSVar1;
  int iVar2;
  SubtreeWrapper *pSVar3;
  undefined4 extraout_var;
  SeqStatement *this_00;
  StatementWrapper *this_01;
  iterator __end3;
  uint uVar4;
  iterator __begin3;
  pointer ppSVar5;
  SeqStatement *statement;
  Statement *local_50;
  vector<IRT::Statement_*,_std::allocator<IRT::Statement_*>_> ir_statements;
  
  ppSVar5 = (list_of_statements->list_of_statements_).
            super__Vector_base<Statement_*,_std::allocator<Statement_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppSVar1 = (list_of_statements->list_of_statements_).
            super__Vector_base<Statement_*,_std::allocator<Statement_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppSVar5 == ppSVar1) {
    (this->super_TemplateVisitor<IRT::SubtreeWrapper_*>).tos_value_ = (SubtreeWrapper *)0x0;
  }
  else if ((long)ppSVar1 - (long)ppSVar5 == 8) {
    pSVar3 = TemplateVisitor<IRT::SubtreeWrapper_*>::Accept
                       (&this->super_TemplateVisitor<IRT::SubtreeWrapper_*>,&(*ppSVar5)->super_Node)
    ;
    (this->super_TemplateVisitor<IRT::SubtreeWrapper_*>).tos_value_ = pSVar3;
  }
  else {
    ir_statements.super__Vector_base<IRT::Statement_*,_std::allocator<IRT::Statement_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    ir_statements.super__Vector_base<IRT::Statement_*,_std::allocator<IRT::Statement_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    ir_statements.super__Vector_base<IRT::Statement_*,_std::allocator<IRT::Statement_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    for (; ppSVar5 != ppSVar1; ppSVar5 = ppSVar5 + 1) {
      pSVar3 = TemplateVisitor<IRT::SubtreeWrapper_*>::Accept
                         (&this->super_TemplateVisitor<IRT::SubtreeWrapper_*>,
                          &(*ppSVar5)->super_Node);
      if (pSVar3 != (SubtreeWrapper *)0x0) {
        iVar2 = (*pSVar3->_vptr_SubtreeWrapper[3])(pSVar3);
        local_50 = (Statement *)CONCAT44(extraout_var,iVar2);
        std::vector<IRT::Statement*,std::allocator<IRT::Statement*>>::emplace_back<IRT::Statement*>
                  ((vector<IRT::Statement*,std::allocator<IRT::Statement*>> *)&ir_statements,
                   &local_50);
      }
    }
    statement = (SeqStatement *)
                ir_statements.
                super__Vector_base<IRT::Statement_*,_std::allocator<IRT::Statement_*>_>._M_impl.
                super__Vector_impl_data._M_finish[-1];
    for (uVar4 = (int)((ulong)((long)(list_of_statements->list_of_statements_).
                                     super__Vector_base<Statement_*,_std::allocator<Statement_*>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                              (long)(list_of_statements->list_of_statements_).
                                    super__Vector_base<Statement_*,_std::allocator<Statement_*>_>.
                                    _M_impl.super__Vector_impl_data._M_start) >> 3) - 2;
        -1 < (int)uVar4; uVar4 = uVar4 - 1) {
      this_00 = (SeqStatement *)operator_new(0x18);
      IRT::SeqStatement::SeqStatement
                (this_00,ir_statements.
                         super__Vector_base<IRT::Statement_*,_std::allocator<IRT::Statement_*>_>.
                         _M_impl.super__Vector_impl_data._M_start[uVar4],&statement->super_Statement
                );
      statement = this_00;
    }
    this_01 = (StatementWrapper *)operator_new(0x10);
    IRT::StatementWrapper::StatementWrapper(this_01,&statement->super_Statement);
    (this->super_TemplateVisitor<IRT::SubtreeWrapper_*>).tos_value_ = (SubtreeWrapper *)this_01;
    std::_Vector_base<IRT::Statement_*,_std::allocator<IRT::Statement_*>_>::~_Vector_base
              (&ir_statements.
                super__Vector_base<IRT::Statement_*,_std::allocator<IRT::Statement_*>_>);
  }
  return;
}

Assistant:

void IRTreeBuildVisitor::Visit(ListOfStatements* list_of_statements) {
  auto& statements = list_of_statements->list_of_statements_;
  if (statements.empty()) {
    tos_value_ = nullptr;
  } else if (statements.size() == 1) {
    tos_value_ = Accept(statements[0]);
  } else {
    std::vector<IRT::Statement*> ir_statements;
    for (auto&& statement : statements) {
      auto ir_statement = Accept(statement);
      if (ir_statement) {
        ir_statements.emplace_back(ir_statement->ToStatement());
      }
    }

    IRT::Statement* suffix = ir_statements.back();
    for (int i = static_cast<int>(statements.size()) - 2; i >= 0; --i) {
      suffix = new IRT::SeqStatement(ir_statements[i], suffix);
    }

    tos_value_ = new IRT::StatementWrapper(suffix);
  }
}